

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::UnaryAggregateHeap<float,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<float,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          float *value)

{
  ulong uVar1;
  bool bVar2;
  HeapEntry<float> *__last;
  HeapEntry<float> *__first;
  
  __first = this->heap;
  uVar1 = this->size;
  if (uVar1 < this->capacity) {
    this->size = uVar1 + 1;
    __last = __first + uVar1 + 1;
    __first[uVar1].value = *value;
  }
  else {
    bVar2 = GreaterThan::Operation<float>(value,&__first->value);
    if (!bVar2) {
      return;
    }
    ::std::
    pop_heap<duckdb::HeapEntry<float>*,bool(*)(duckdb::HeapEntry<float>const&,duckdb::HeapEntry<float>const&)>
              (this->heap,this->heap + this->size,Compare);
    __first = this->heap;
    __last = __first + this->size;
    __last[-1].value = *value;
  }
  ::std::
  push_heap<duckdb::HeapEntry<float>*,bool(*)(duckdb::HeapEntry<float>const&,duckdb::HeapEntry<float>const&)>
            (__first,__last,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}